

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O3

APInt * __thiscall llvm::APInt::operator++(APInt *this)

{
  uint64_t *puVar1;
  uint uVar2;
  APInt *pAVar3;
  uint64_t *puVar4;
  ulong uVar5;
  ulong uVar6;
  
  pAVar3 = this;
  uVar2 = this->BitWidth;
  if ((ulong)uVar2 < 0x41) {
    puVar4 = (uint64_t *)((this->U).VAL + 1);
    (this->U).pVal = puVar4;
  }
  else {
    puVar4 = (this->U).pVal;
    uVar5 = (ulong)uVar2 + 0x3f >> 6;
    *puVar4 = *puVar4 + 1;
    if (*puVar4 == 0) {
      uVar6 = 1;
      do {
        if (uVar5 == uVar6) break;
        puVar1 = puVar4 + uVar6;
        *puVar1 = *puVar1 + 1;
        uVar6 = uVar6 + 1;
      } while (*puVar1 == 0);
    }
    this = (APInt *)((this->U).pVal + ((int)uVar5 - 1));
    puVar4 = (uint64_t *)(this->U).VAL;
  }
  (this->U).VAL = (ulong)((long)puVar4 << (-(char)uVar2 & 0x3fU)) >> (-(char)uVar2 & 0x3fU);
  return pAVar3;
}

Assistant:

APInt& APInt::operator++() {
  if (isSingleWord())
    ++U.VAL;
  else
    tcIncrement(U.pVal, getNumWords());
  return clearUnusedBits();
}